

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addBend(Molecule *this,Bend *bend)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *in_RDI;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::begin(in_RDI);
  __val = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::Bend**,std::vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>>>,OpenMD::Bend*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::push_back
              ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)__last._M_current,
               __val._M_current);
  }
  return;
}

Assistant:

void Molecule::addBend(Bend* bend) {
    if (std::find(bends_.begin(), bends_.end(), bend) == bends_.end()) {
      bends_.push_back(bend);
    }
  }